

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddComplement(DdManager *dd,DdNode *node)

{
  DdManager *local_38;
  DdNode *zdd_I;
  DdNode *isop;
  DdNode *b;
  DdNode *node_local;
  DdManager *dd_local;
  
  b = node;
  node_local = &dd->sentinel;
  local_38 = (DdManager *)cuddCacheLookup1Zdd(dd,cuddZddComplement,node);
  dd_local = local_38;
  if (local_38 == (DdManager *)0x0) {
    isop = cuddMakeBddFromZddCover((DdManager *)node_local,b);
    if (isop == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)isop & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)isop & 0xfffffffffffffffe) + 4) + 1;
      zdd_I = cuddZddIsop((DdManager *)node_local,(DdNode *)((ulong)isop ^ 1),
                          (DdNode *)((ulong)isop ^ 1),(DdNode **)&local_38);
      if (zdd_I == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)node_local,isop);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)zdd_I & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)zdd_I & 0xfffffffffffffffe) + 4) + 1;
        *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)node_local,isop);
        Cudd_RecursiveDeref((DdManager *)node_local,zdd_I);
        cuddCacheInsert1((DdManager *)node_local,cuddZddComplement,b,&local_38->sentinel);
        *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) + -1;
        dd_local = local_38;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddComplement(
  DdManager * dd,
  DdNode *node)
{
    DdNode      *b, *isop, *zdd_I;

    /* Check cache */
    zdd_I = cuddCacheLookup1Zdd(dd, cuddZddComplement, node);
    if (zdd_I)
        return(zdd_I);

    b = cuddMakeBddFromZddCover(dd, node);
    if (!b)
        return(NULL);
    cuddRef(b);
    isop = cuddZddIsop(dd, Cudd_Not(b), Cudd_Not(b), &zdd_I);
    if (!isop) {
        Cudd_RecursiveDeref(dd, b);
        return(NULL);
    }
    cuddRef(isop);
    cuddRef(zdd_I);
    Cudd_RecursiveDeref(dd, b);
    Cudd_RecursiveDeref(dd, isop);

    cuddCacheInsert1(dd, cuddZddComplement, node, zdd_I);
    cuddDeref(zdd_I);
    return(zdd_I);
}